

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void legendre_associated_values(int *n_data,int *n,int *m,double *x,double *fx)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = *n_data;
  if ((int)uVar2 < 0) {
    *n_data = 0;
    uVar2 = 0;
  }
  else if (0x12 < uVar2) {
    *n_data = 0;
    *n = 0;
    *m = 0;
    *x = 0.0;
    *fx = 0.0;
    return;
  }
  *n = (&DAT_00227af0)[uVar2];
  *m = *(int *)(&DAT_00227b40 + (long)*n_data * 4);
  iVar1 = *n_data;
  *x = *(double *)(&DAT_00227c30 + (long)iVar1 * 8);
  *fx = *(double *)(&DAT_00227b90 + (long)iVar1 * 8);
  *n_data = iVar1 + 1;
  return;
}

Assistant:

void legendre_associated_values ( int *n_data, int *n, int *m, double *x, 
  double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED_VALUES returns values of associated Legendre functions.
//
//  Discussion:
//
//    The function considered is the associated Legendre function P^M_N(X).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and
//    N_DATA is set to the index of the test data.  On each subsequent
//    call, N_DATA is incremented and that test data is returned.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, int *M, double *X, the arguments of the function.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 19

  int n_vec[N_MAX] = {
     1,  1,  1,  1, 
     1,  2,  2,  2, 
     3,  3,  3,  3, 
     4,  5,  6,  7, 
     8,  9, 10 };
  int m_vec[N_MAX] = {
     0,  0,  0,  0, 
     1,  0,  1,  2, 
     0,  1,  2,  3, 
     2,  2,  3,  3, 
     4,  4,  5 };
  double fx_vec[N_MAX] = {
     0.000000,  0.500000,  0.707107,  1.000000, 
    -0.866025, -0.125000, -1.29904,   2.25000, 
    -0.437500, -0.324759,  5.62500,  -9.74278, 
     4.21875,  -4.92187,   12.7874,   116.685, 
    -1050.67,  -2078.49,   30086.2 };
  double x_vec[N_MAX] = {
    0.0,       0.5,       0.7071067, 1.0, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *m = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *m = m_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}